

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_vfs_write(ma_vfs *pVFS,ma_vfs_file file,void *pSrc,size_t sizeInBytes,
                      size_t *pBytesWritten)

{
  ma_result mVar1;
  
  if (pBytesWritten != (size_t *)0x0) {
    *pBytesWritten = 0;
  }
  if (pSrc == (void *)0x0 || (file == (ma_vfs_file)0x0 || pVFS == (ma_vfs *)0x0)) {
    mVar1 = MA_INVALID_ARGS;
  }
  else {
    if (*(code **)((long)pVFS + 0x20) != (code *)0x0) {
      mVar1 = (**(code **)((long)pVFS + 0x20))();
      return mVar1;
    }
    mVar1 = MA_NOT_IMPLEMENTED;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_vfs_write(ma_vfs* pVFS, ma_vfs_file file, const void* pSrc, size_t sizeInBytes, size_t* pBytesWritten)
{
    ma_vfs_callbacks* pCallbacks = (ma_vfs_callbacks*)pVFS;

    if (pBytesWritten != NULL) {
        *pBytesWritten = 0;
    }

    if (pVFS == NULL || file == NULL || pSrc == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pCallbacks->onWrite == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    return pCallbacks->onWrite(pVFS, file, pSrc, sizeInBytes, pBytesWritten);
}